

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_states.cpp
# Opt level: O3

void ParseFunctionParameters
               (FScanner *sc,PClassActor *cls,TArray<FxExpression_*,_FxExpression_*> *out_params,
               PFunction *afd,FString *statestring,FStateDefinitions *statedef)

{
  PPrototype *pPVar1;
  PStatePointer *pPVar2;
  bool bVar3;
  int iVar4;
  FxExpression *this;
  PType **ppPVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  FScriptPosition local_80;
  uint local_70;
  int local_6c;
  Variant *local_68;
  FStateDefinitions *local_60;
  _func_int **local_58;
  _func_int **local_50;
  PFunction *local_48;
  FString *local_40;
  PClassActor *local_38;
  
  local_68 = (afd->Variants).Array;
  pPVar1 = local_68->Implementation->Proto;
  uVar8 = afd->Flags;
  iVar7 = (int)(uVar8 << 0x1e) >> 0x1f;
  uVar10 = (ulong)(uVar8 >> 1 & 3);
  iVar4 = iVar7 + -2;
  if ((uVar8 & 4) == 0) {
    iVar4 = iVar7;
  }
  iVar4 = iVar4 + (pPVar1->ArgumentTypes).Count;
  local_60 = statedef;
  local_40 = statestring;
  local_38 = cls;
  if (iVar4 < 0) {
    __assert_fail("numparams >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_states.cpp"
                  ,0x272,
                  "void ParseFunctionParameters(FScanner &, PClassActor *, TArray<FxExpression *> &, PFunction *, FString, FStateDefinitions *)"
                 );
  }
  local_48 = afd;
  if (iVar4 == 0) {
    bVar3 = FScanner::CheckString(sc,"(");
    if (!bVar3) {
      return;
    }
  }
  else {
    if (((local_68->ArgFlags).Array[uVar10] & 1) == 0) {
      FScanner::MustGetStringName(sc,"(");
    }
    else {
      bVar3 = FScanner::CheckString(sc,"(");
      if (!bVar3) {
        return;
      }
    }
    local_58 = (_func_int **)&PTR__FxConstant_0088f2f0;
    local_50 = (_func_int **)&PTR__FxExpression_0088f3c0;
    iVar7 = iVar4;
    do {
      ppPVar5 = (pPVar1->ArgumentTypes).Array;
      iVar9 = (int)uVar10;
      if ((local_60 == (FStateDefinitions *)0x0) || (ppPVar5[iVar9] != (PType *)TypeState)) {
LAB_006a4786:
        this = ParseParameter(sc,local_38,ppPVar5[iVar9],false);
      }
      else {
        bVar3 = FScanner::CheckNumber(sc);
        if (!bVar3) {
          ppPVar5 = (pPVar1->ArgumentTypes).Array;
          goto LAB_006a4786;
        }
        iVar6 = sc->Number;
        if (iVar6 < 1) {
LAB_006a4721:
          if (iVar6 < 0) {
            FScanner::ScriptError(sc,"Negative jump offsets are not allowed");
          }
          else if (iVar6 != 0) goto LAB_006a472f;
          this = (FxExpression *)operator_new(0x48);
          FScriptPosition::FScriptPosition(&local_80,sc);
          FxExpression::FxExpression(this,&local_80);
          this->_vptr_FxExpression = local_58;
          this[1].JumpAddresses.Array = (FxJumpStatement **)0x0;
          pPVar2 = TypeState;
          this[1]._vptr_FxExpression = (_func_int **)TypeState;
          this->ValueType = (PType *)pPVar2;
          this->isresolved = true;
        }
        else {
          if (1 < *(uint *)(local_40->Chars + -0xc)) {
            FScanner::ScriptError
                      (sc,
                       "You cannot use state jumps commands with a jump offset on multistate definitions\n"
                      );
            iVar6 = sc->Number;
            goto LAB_006a4721;
          }
LAB_006a472f:
          local_6c = iVar6;
          this = (FxExpression *)operator_new(0x38);
          local_70 = (local_60->StateArray).Count;
          FScriptPosition::FScriptPosition(&local_80,sc);
          FxExpression::FxExpression(this,&local_80);
          this->_vptr_FxExpression = local_50;
          *(uint *)&this->field_0x34 = local_70 + local_6c;
        }
        FString::~FString(&local_80.FileName);
      }
      TArray<FxExpression_*,_FxExpression_*>::Grow(out_params,1);
      uVar8 = out_params->Count;
      out_params->Array[uVar8] = this;
      out_params->Count = uVar8 + 1;
      if (iVar7 == 1) break;
      uVar8 = iVar9 + 1;
      if ((pPVar1->ArgumentTypes).Array[(int)uVar8] == (PType *)0x0) {
        bVar3 = FScanner::CheckString(sc,")");
LAB_006a4819:
        if (bVar3 != false) {
          return;
        }
      }
      else {
        iVar7 = iVar7 + -1;
        if (((local_68->ArgFlags).Array[(int)uVar8] & 1) != 0) {
          bVar3 = FScanner::CheckString(sc,")");
          uVar10 = (ulong)uVar8;
          goto LAB_006a4819;
        }
        uVar10 = (ulong)uVar8;
      }
      FScanner::MustGetStringName(sc,",");
    } while (0 < iVar7);
  }
  if (iVar4 == 0) {
    bVar3 = FScanner::CheckString(sc,")");
    if (!bVar3) {
      FScanner::ScriptError
                (sc,"You cannot pass parameters to \'%s\'\n",
                 FName::NameData.NameArray
                 [*(int *)&(local_48->super_PSymbol).super_DObject.field_0x24].Text);
    }
  }
  else {
    FScanner::MustGetStringName(sc,")");
  }
  return;
}

Assistant:

void ParseFunctionParameters(FScanner &sc, PClassActor *cls, TArray<FxExpression *> &out_params,
	PFunction *afd, FString statestring, FStateDefinitions *statedef)
{
	const TArray<PType *> &params = afd->Variants[0].Implementation->Proto->ArgumentTypes;
	const TArray<DWORD> &paramflags = afd->Variants[0].ArgFlags;
	int numparams = (int)params.Size();
	int pnum = 0;
	bool zeroparm;

	if (afd->Flags & VARF_Method)
	{
		numparams--;
		pnum++;
	}
	if (afd->Flags & VARF_Action)
	{
		numparams -= 2;
		pnum += 2;
	}
	assert(numparams >= 0);
	zeroparm = numparams == 0;
	if (numparams > 0 && !(paramflags[pnum] & VARF_Optional))
	{
		sc.MustGetStringName("(");
	}
	else
	{
		if (!sc.CheckString("(")) 
		{
			return;
		}
	}
	while (numparams > 0)
	{
		FxExpression *x;
		if (statedef != NULL && params[pnum] == TypeState && sc.CheckNumber())
		{
			// Special case: State label as an offset
			if (sc.Number > 0 && statestring.Len() > 1)
			{
				sc.ScriptError("You cannot use state jumps commands with a jump offset on multistate definitions\n");
			}

			int v = sc.Number;
			if (v < 0)
			{
				sc.ScriptError("Negative jump offsets are not allowed");
			}

			if (v > 0)
			{
				x = new FxStateByIndex(statedef->GetStateCount() + v, sc);
			}
			else
			{
				x = new FxConstant((FState*)NULL, sc);
			}
		}
		else
		{
			// Use the generic parameter parser for everything else
			x = ParseParameter(sc, cls, params[pnum], false);
		}
		out_params.Push(x);
		pnum++;
		numparams--;
		if (numparams > 0)
		{
			if (params[pnum] == NULL)
			{ // varargs function
				if (sc.CheckString(")"))
				{
					return;
				}
				pnum--;
				numparams++;
			}
			else if ((paramflags[pnum] & VARF_Optional) && sc.CheckString(")"))
			{
				return;
			}
			sc.MustGetStringName (",");
		}
	}
	if (zeroparm)
	{
		if (!sc.CheckString(")"))
		{
			sc.ScriptError("You cannot pass parameters to '%s'\n", afd->SymbolName.GetChars());
		}
	}
	else
	{
		sc.MustGetStringName(")");
	}
}